

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void pointerHandleMotion(void *userData,wl_pointer *pointer,uint32_t time,wl_fixed_t sx,
                        wl_fixed_t sy)

{
  _GLFWwindow *p_Var1;
  wl_cursor *wl_surface;
  wl_buffer *wl_surface_00;
  wl_fixed_t in_ECX;
  wl_fixed_t in_R8D;
  double dVar2;
  wl_pointer *wl_pointer;
  wl_buffer *buffer;
  wl_cursor_image *image;
  wl_cursor *cursor;
  int scale;
  wl_cursor_theme *theme;
  wl_surface *surface;
  char *cursorName;
  double ypos;
  double xpos;
  _GLFWwindow *window;
  double in_stack_ffffffffffffff88;
  _GLFWwindow *in_stack_ffffffffffffff90;
  wl_cursor_image *pwVar3;
  int32_t in_stack_ffffffffffffffa8;
  int32_t width;
  wl_cursor_theme *wl_surface_01;
  wl_surface *surface_00;
  char *pcVar4;
  int32_t scale_00;
  
  p_Var1 = _glfw.wl.pointerFocus;
  if ((_glfw.wl.pointerFocus != (_GLFWwindow *)0x0) &&
     ((_glfw.wl.pointerFocus)->cursorMode != 0x34003)) {
    dVar2 = wl_fixed_to_double(in_ECX);
    wl_pointer = (wl_pointer *)wl_fixed_to_double(in_R8D);
    (p_Var1->wl).cursorPosX = dVar2;
    (p_Var1->wl).cursorPosY = (double)wl_pointer;
    if ((p_Var1->wl).hovered == 0) {
      if ((p_Var1->wl).fallback.decorations != 0) {
        pcVar4 = "left_ptr";
        if (p_Var1->resizable != 0) {
          if ((p_Var1->wl).fallback.focus == (p_Var1->wl).fallback.top.surface) {
            if ((double)wl_pointer < 4.0) {
              pcVar4 = "n-resize";
            }
          }
          else if ((p_Var1->wl).fallback.focus == (p_Var1->wl).fallback.left.surface) {
            if (4.0 <= (double)wl_pointer) {
              pcVar4 = "w-resize";
            }
            else {
              pcVar4 = "nw-resize";
            }
          }
          else if ((p_Var1->wl).fallback.focus == (p_Var1->wl).fallback.right.surface) {
            if (4.0 <= (double)wl_pointer) {
              pcVar4 = "e-resize";
            }
            else {
              pcVar4 = "ne-resize";
            }
          }
          else if ((p_Var1->wl).fallback.focus == (p_Var1->wl).fallback.bottom.surface) {
            if (4.0 <= dVar2) {
              if (dVar2 <= (double)((p_Var1->wl).width + 4)) {
                pcVar4 = "s-resize";
              }
              else {
                pcVar4 = "se-resize";
              }
            }
            else {
              pcVar4 = "sw-resize";
            }
          }
        }
        if (_glfw.wl.cursorPreviousName != pcVar4) {
          width = 1;
          wl_surface_01 = _glfw.wl.cursorTheme;
          if ((1 < (p_Var1->wl).bufferScale) &&
             (_glfw.wl.cursorThemeHiDPI != (wl_cursor_theme *)0x0)) {
            width = 2;
            wl_surface_01 = _glfw.wl.cursorThemeHiDPI;
          }
          surface_00 = _glfw.wl.cursorSurface;
          wl_surface = (*_glfw.wl.cursor.theme_get_cursor)(wl_surface_01,pcVar4);
          if ((wl_surface != (wl_cursor *)0x0) &&
             (pwVar3 = *wl_surface->images, pwVar3 != (wl_cursor_image *)0x0)) {
            wl_surface_00 = (*_glfw.wl.cursor.image_get_buffer)(pwVar3);
            scale_00 = (int32_t)((ulong)pwVar3 >> 0x20);
            if (wl_surface_00 != (wl_buffer *)0x0) {
              wl_pointer_set_cursor
                        (wl_pointer,(uint32_t)((ulong)pcVar4 >> 0x20),surface_00,
                         (int32_t)((ulong)wl_surface_01 >> 0x20),(int32_t)wl_surface_01);
              wl_surface_set_buffer_scale((wl_surface *)wl_surface,scale_00);
              wl_surface_attach((wl_surface *)wl_surface_01,
                                (wl_buffer *)CONCAT44(width,in_stack_ffffffffffffffa8),
                                (int32_t)((ulong)wl_surface >> 0x20),(int32_t)wl_surface);
              wl_surface_damage(surface_00,(int32_t)((ulong)wl_surface_01 >> 0x20),
                                (int32_t)wl_surface_01,width,in_stack_ffffffffffffffa8);
              wl_surface_commit((wl_surface *)wl_surface_00);
              _glfw.wl.cursorPreviousName = pcVar4;
            }
          }
        }
      }
    }
    else {
      _glfw.wl.cursorPreviousName = (char *)0x0;
      _glfwInputCursorPos(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,5.73164913455091e-317)
      ;
    }
  }
  return;
}

Assistant:

static void pointerHandleMotion(void* userData,
                                struct wl_pointer* pointer,
                                uint32_t time,
                                wl_fixed_t sx,
                                wl_fixed_t sy)
{
    _GLFWwindow* window = _glfw.wl.pointerFocus;
    if (!window)
        return;

    if (window->cursorMode == GLFW_CURSOR_DISABLED)
        return;

    const double xpos = wl_fixed_to_double(sx);
    const double ypos = wl_fixed_to_double(sy);
    window->wl.cursorPosX = xpos;
    window->wl.cursorPosY = ypos;

    if (window->wl.hovered)
    {
        _glfw.wl.cursorPreviousName = NULL;
        _glfwInputCursorPos(window, xpos, ypos);
        return;
    }

    if (window->wl.fallback.decorations)
    {
        const char* cursorName = "left_ptr";

        if (window->resizable)
        {
            if (window->wl.fallback.focus == window->wl.fallback.top.surface)
            {
                if (ypos < GLFW_BORDER_SIZE)
                    cursorName = "n-resize";
            }
            else if (window->wl.fallback.focus == window->wl.fallback.left.surface)
            {
                if (ypos < GLFW_BORDER_SIZE)
                    cursorName = "nw-resize";
                else
                    cursorName = "w-resize";
            }
            else if (window->wl.fallback.focus == window->wl.fallback.right.surface)
            {
                if (ypos < GLFW_BORDER_SIZE)
                    cursorName = "ne-resize";
                else
                    cursorName = "e-resize";
            }
            else if (window->wl.fallback.focus == window->wl.fallback.bottom.surface)
            {
                if (xpos < GLFW_BORDER_SIZE)
                    cursorName = "sw-resize";
                else if (xpos > window->wl.width + GLFW_BORDER_SIZE)
                    cursorName = "se-resize";
                else
                    cursorName = "s-resize";
            }
        }

        if (_glfw.wl.cursorPreviousName != cursorName)
        {
            struct wl_surface* surface = _glfw.wl.cursorSurface;
            struct wl_cursor_theme* theme = _glfw.wl.cursorTheme;
            int scale = 1;

            if (window->wl.bufferScale > 1 && _glfw.wl.cursorThemeHiDPI)
            {
                // We only support up to scale=2 for now, since libwayland-cursor
                // requires us to load a different theme for each size.
                scale = 2;
                theme = _glfw.wl.cursorThemeHiDPI;
            }

            struct wl_cursor* cursor = wl_cursor_theme_get_cursor(theme, cursorName);
            if (!cursor)
                return;

            // TODO: handle animated cursors too.
            struct wl_cursor_image* image = cursor->images[0];
            if (!image)
                return;

            struct wl_buffer* buffer = wl_cursor_image_get_buffer(image);
            if (!buffer)
                return;

            wl_pointer_set_cursor(_glfw.wl.pointer, _glfw.wl.pointerEnterSerial,
                                  surface,
                                  image->hotspot_x / scale,
                                  image->hotspot_y / scale);
            wl_surface_set_buffer_scale(surface, scale);
            wl_surface_attach(surface, buffer, 0, 0);
            wl_surface_damage(surface, 0, 0, image->width, image->height);
            wl_surface_commit(surface);

            _glfw.wl.cursorPreviousName = cursorName;
        }
    }
}